

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

void __thiscall
despot::TagHistoryModePolicy::TagHistoryModePolicy
          (TagHistoryModePolicy *this,DSPOMDP *model,ParticleLowerBound *bound)

{
  int iVar1;
  Floor *extraout_RAX;
  double __x;
  BaseTag *local_50;
  ParticleLowerBound *bound_local;
  DSPOMDP *model_local;
  TagHistoryModePolicy *this_local;
  
  despot::DefaultPolicy::DefaultPolicy(&this->super_DefaultPolicy,model,bound);
  *(undefined ***)this = &PTR__TagHistoryModePolicy_001588d0;
  if (model == (DSPOMDP *)0x0) {
    local_50 = (BaseTag *)0x0;
  }
  else {
    local_50 = (BaseTag *)(model + -0x38);
  }
  this->tag_model_ = local_50;
  despot::Floor::Floor(&this->floor_);
  std::
  vector<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::vector(&this->paths_);
  std::vector<double,_std::allocator<double>_>::vector(&this->state_probs_);
  BaseTag::floor(this->tag_model_,__x);
  Floor::operator=(&this->floor_,extraout_RAX);
  iVar1 = (**(code **)(*(long *)this->tag_model_ + 0x10))();
  std::vector<double,_std::allocator<double>_>::resize(&this->state_probs_,(long)iVar1);
  iVar1 = (**(code **)(*(long *)this->tag_model_ + 0x18))();
  std::
  vector<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::resize(&this->paths_,(long)iVar1);
  this->belief_ = (Belief *)0x0;
  return;
}

Assistant:

TagHistoryModePolicy(const DSPOMDP* model, ParticleLowerBound* bound) :
	DefaultPolicy(model, bound),
	tag_model_(static_cast<const BaseTag*>(model)) {
		floor_ = tag_model_->floor();
		state_probs_.resize(tag_model_->NumStates());
		paths_.resize(tag_model_->NumActions());
		belief_ = NULL;
	}